

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O0

void __thiscall wasm::Analyzer::useCallRefType(Analyzer *this,HeapType type)

{
  ModuleElement element;
  bool bVar1;
  SubTypes *this_00;
  reference pHVar2;
  size_type sVar3;
  pointer ppVar4;
  reference pNVar5;
  ModuleItemKind local_114;
  pair<wasm::ModuleItemKind,_wasm::Name> local_110;
  undefined1 auStack_f8 [8];
  Name target;
  _Node_iterator_base<wasm::Name,_true> local_e0;
  iterator __end4;
  iterator __begin4;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *__range4;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_true>
  local_b0;
  iterator iter;
  HeapType subType;
  iterator __end2;
  iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_88;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_70;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  Analyzer *local_18;
  Analyzer *this_local;
  HeapType type_local;
  
  local_18 = this;
  this_local = (Analyzer *)type.id;
  bVar1 = HeapType::isBasic((HeapType *)&this_local);
  if (!bVar1) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->subTypes);
    if (!bVar1) {
      SubTypes::SubTypes((SubTypes *)&__range2,this->module);
      std::optional<wasm::SubTypes>::operator=(&this->subTypes,(SubTypes *)&__range2);
      SubTypes::~SubTypes((SubTypes *)&__range2);
    }
    this_00 = std::optional<wasm::SubTypes>::operator->(&this->subTypes);
    SubTypes::getSubTypes(&local_88,this_00,(HeapType)this_local);
    local_70 = &local_88;
    __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(local_70);
    subType.id = (uintptr_t)
                 std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(local_70);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                       *)&subType), bVar1) {
      pHVar2 = __gnu_cxx::
               __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end2);
      iter.
      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_true>
                 )pHVar2->id;
      local_b0._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
           ::find(&this->uncalledRefFuncMap,(key_type *)&iter);
      __range4 = (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)std::
                    unordered_map<wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                    ::end(&this->uncalledRefFuncMap);
      bVar1 = std::__detail::operator!=
                        (&local_b0,
                         (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_true>
                          *)&__range4);
      if (bVar1) {
        sVar3 = std::
                unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                ::count(&this->calledSignatures,(key_type *)&iter);
        if (sVar3 != 0) {
          __assert_fail("calledSignatures.count(subType) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedModuleElements.cpp"
                        ,0x12e,"void wasm::Analyzer::useCallRefType(HeapType)");
        }
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false,_true>
                               *)&local_b0);
        __end4 = std::
                 unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                 ::begin(&ppVar4->second);
        local_e0._M_cur =
             (__node_type *)
             std::
             unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
             ::end(&ppVar4->second);
        while (bVar1 = std::__detail::operator!=
                                 (&__end4.super__Node_iterator_base<wasm::Name,_true>,&local_e0),
              bVar1) {
          pNVar5 = std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end4);
          auStack_f8 = (undefined1  [8])(pNVar5->super_IString).str._M_len;
          target.super_IString.str._M_len = (size_t)(pNVar5->super_IString).str._M_str;
          local_114 = Function;
          std::pair<wasm::ModuleItemKind,_wasm::Name>::
          pair<wasm::ModuleItemKind,_wasm::Name_&,_true>(&local_110,&local_114,(Name *)auStack_f8);
          element.second.super_IString.str._M_len = local_110.second.super_IString.str._M_len;
          element.first = local_110.first;
          element._4_4_ = local_110._4_4_;
          element.second.super_IString.str._M_str = local_110.second.super_IString.str._M_str;
          use(this,element);
          std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end4);
        }
        std::
        unordered_map<wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
        ::erase(&this->uncalledRefFuncMap,(iterator)local_b0._M_cur);
      }
      std::
      unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
      ::insert(&this->calledSignatures,(value_type *)&iter);
      __gnu_cxx::
      __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end2);
    }
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_88);
  }
  return;
}

Assistant:

void useCallRefType(HeapType type) {
    if (type.isBasic()) {
      // Nothing to do for something like a bottom type; attempts to call such a
      // type will trap at runtime.
      return;
    }

    if (!subTypes) {
      subTypes = SubTypes(*module);
    }

    // Call all the functions of that signature, and subtypes. We can then
    // forget about them, as those signatures will be marked as called.
    for (auto subType : subTypes->getSubTypes(type)) {
      auto iter = uncalledRefFuncMap.find(subType);
      if (iter != uncalledRefFuncMap.end()) {
        // We must not have a type in both calledSignatures and
        // uncalledRefFuncMap: once it is called, we do not track RefFuncs for
        // it any more.
        assert(calledSignatures.count(subType) == 0);

        for (Name target : iter->second) {
          use({ModuleElementKind::Function, target});
        }

        uncalledRefFuncMap.erase(iter);
      }

      calledSignatures.insert(subType);
    }
  }